

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O3

SourceFileFlags __thiscall
cmGeneratorTarget::GetTargetSourceFileFlags(cmGeneratorTarget *this,cmSourceFile *sf)

{
  _Rb_tree_header *p_Var1;
  int iVar2;
  int iVar3;
  cmValue cVar4;
  ulong uVar5;
  _Base_ptr p_Var6;
  _Base_ptr p_Var7;
  SourceFileFlags SVar8;
  basic_string_view<char,_std::char_traits<char>_> __str;
  string local_40;
  
  ConstructSourceFileFlags(this);
  p_Var7 = (this->SourceFlagsMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  if (p_Var7 != (_Base_ptr)0x0) {
    p_Var1 = &(this->SourceFlagsMap)._M_t._M_impl.super__Rb_tree_header;
    p_Var6 = &p_Var1->_M_header;
    do {
      if (*(cmSourceFile **)(p_Var7 + 1) >= sf) {
        p_Var6 = p_Var7;
      }
      p_Var7 = (&p_Var7->_M_left)[*(cmSourceFile **)(p_Var7 + 1) < sf];
    } while (p_Var7 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)p_Var6 != p_Var1) && (*(cmSourceFile **)(p_Var6 + 1) <= sf)) {
      uVar5 = (ulong)*(uint *)&p_Var6[1]._M_parent;
      p_Var7 = p_Var6[1]._M_left;
      goto LAB_003ed9c6;
    }
  }
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"MACOSX_PACKAGE_LOCATION","");
  cVar4 = cmSourceFile::GetProperty(sf,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  if (cVar4.Value == (string *)0x0) {
    uVar5 = 0;
    p_Var7 = (_Base_ptr)0x0;
  }
  else {
    p_Var7 = (_Base_ptr)((cVar4.Value)->_M_dataplus)._M_p;
    iVar2 = (*this->GlobalGenerator->_vptr_cmGlobalGenerator[0x30])
                      (this->GlobalGenerator,this->Makefile);
    iVar3 = std::__cxx11::string::compare((char *)cVar4.Value);
    if (iVar3 == 0) {
      if ((char)iVar2 != '\0') {
        p_Var7 = (_Base_ptr)0x70ce89;
      }
      uVar5 = 3;
    }
    else {
      local_40._M_string_length = (size_type)((cVar4.Value)->_M_dataplus)._M_p;
      local_40._M_dataplus._M_p = (pointer)(cVar4.Value)->_M_string_length;
      __str._M_str = "Resources/";
      __str._M_len = 10;
      iVar3 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                        ((basic_string_view<char,_std::char_traits<char>_> *)&local_40,0,10,__str);
      uVar5 = 5;
      if (iVar3 == 0) {
        if ((char)iVar2 != '\0') {
          p_Var7 = (_Base_ptr)((long)&p_Var7->_M_parent + 2);
        }
        uVar5 = 4;
      }
    }
  }
LAB_003ed9c6:
  SVar8.MacFolder = (char *)p_Var7;
  SVar8._0_8_ = uVar5;
  return SVar8;
}

Assistant:

struct cmGeneratorTarget::SourceFileFlags
cmGeneratorTarget::GetTargetSourceFileFlags(const cmSourceFile* sf) const
{
  struct SourceFileFlags flags;
  this->ConstructSourceFileFlags();
  auto si = this->SourceFlagsMap.find(sf);
  if (si != this->SourceFlagsMap.end()) {
    flags = si->second;
  } else {
    // Handle the MACOSX_PACKAGE_LOCATION property on source files that
    // were not listed in one of the other lists.
    if (cmValue location = sf->GetProperty("MACOSX_PACKAGE_LOCATION")) {
      flags.MacFolder = location->c_str();
      const bool stripResources =
        this->GlobalGenerator->ShouldStripResourcePath(this->Makefile);
      if (*location == "Resources") {
        flags.Type = cmGeneratorTarget::SourceFileTypeResource;
        if (stripResources) {
          flags.MacFolder = "";
        }
      } else if (cmHasLiteralPrefix(*location, "Resources/")) {
        flags.Type = cmGeneratorTarget::SourceFileTypeDeepResource;
        if (stripResources) {
          flags.MacFolder += cmStrLen("Resources/");
        }
      } else {
        flags.Type = cmGeneratorTarget::SourceFileTypeMacContent;
      }
    }
  }
  return flags;
}